

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

int covscript_args(int args_size,char **args)

{
  char *__s1;
  undefined *this;
  int iVar1;
  unsigned_long size;
  bool *pbVar2;
  fatal_error *pfVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int local_b8;
  int local_b4;
  int local_b0;
  allocator local_a9;
  char **local_a8;
  int local_9c;
  string local_98;
  long local_78;
  string local_70;
  string local_50;
  
  local_78 = (long)args_size;
  local_9c = 1;
  if (1 < args_size) {
    local_9c = args_size;
  }
  iVar6 = 0;
  lVar4 = 1;
  iVar5 = 2;
  local_b4 = 0;
  local_b8 = 0;
  local_b0 = 0;
  local_a8 = args;
  do {
    this = cs::current_process;
    iVar1 = local_9c;
    if (local_78 <= lVar4) {
LAB_00121558:
      if (((iVar6 != 1) && (local_b4 != 1)) && (local_b8 != 1)) {
        return iVar1;
      }
      pfVar3 = (fatal_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_98,"argument syntax error.",(allocator *)&local_70);
      cs::fatal_error::fatal_error(pfVar3,&local_98);
      __cxa_throw(pfVar3,&cs::fatal_error::typeinfo,cs::fatal_error::~fatal_error);
    }
    if (iVar6 == 1) {
      std::__cxx11::string::string((string *)&local_70,local_a8[lVar4],(allocator *)&local_50);
      cs::process_path(&local_98,&local_70);
      std::__cxx11::string::operator=((string *)&csym_path_abi_cxx11_,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_70);
      iVar6 = 2;
    }
    else if (local_b4 == 1) {
      std::__cxx11::string::string((string *)&local_70,local_a8[lVar4],(allocator *)&local_50);
      cs::process_path(&local_98,&local_70);
      std::__cxx11::string::operator=((string *)&log_path_abi_cxx11_,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_70);
      local_b4 = 2;
    }
    else if (local_b8 == 1) {
      std::__cxx11::string::string((string *)&local_50,local_a8[lVar4],&local_a9);
      cs::process_path(&local_70,&local_50);
      std::operator+(&local_98,':',&local_70);
      std::__cxx11::string::append((string *)(cs::current_process + 0x58));
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      local_b8 = 2;
    }
    else if (local_b0 == 1) {
      std::__cxx11::string::string((string *)&local_98,local_a8[lVar4],(allocator *)&local_70);
      size = std::__cxx11::stoul(&local_98,(size_t *)0x0,10);
      cs::process_context::resize_stack((process_context *)this,size);
      std::__cxx11::string::~string((string *)&local_98);
      local_b0 = 2;
    }
    else {
      __s1 = local_a8[lVar4];
      if (*__s1 != '-') {
        iVar1 = (int)lVar4;
        goto LAB_00121558;
      }
      iVar1 = strcmp(__s1,"--args");
      if ((iVar1 == 0) || ((__s1[1] == 'a' && (__s1[2] == '\0')))) {
        repl = true;
        return iVar5;
      }
      iVar1 = strcmp(__s1,"--silent");
      if (((iVar1 == 0) || ((__s1[1] == 's' && (__s1[2] == '\0')))) && (silent == false)) {
        pbVar2 = &silent;
      }
      else {
        iVar1 = strcmp(__s1,"--dump-ast");
        if (((iVar1 == 0) || ((__s1[1] == 'd' && (__s1[2] == '\0')))) && (dump_ast == false)) {
          pbVar2 = &dump_ast;
        }
        else {
          iVar1 = strcmp(__s1,"--dependency");
          if (((iVar1 == 0) || ((__s1[1] == 'r' && (__s1[2] == '\0')))) &&
             (dump_dependency == false)) {
            pbVar2 = &dump_dependency;
          }
          else {
            iVar1 = strcmp(__s1,"--no-optimize");
            if (((iVar1 == 0) || ((__s1[1] == 'o' && (__s1[2] == '\0')))) && (no_optimize == false))
            {
              pbVar2 = &no_optimize;
            }
            else {
              iVar1 = strcmp(__s1,"--compile-only");
              if (((iVar1 == 0) || ((__s1[1] == 'c' && (__s1[2] == '\0')))) &&
                 (compile_only == false)) {
                pbVar2 = &compile_only;
              }
              else {
                iVar1 = strcmp(__s1,"--help");
                if (((iVar1 == 0) || ((__s1[1] == 'h' && (__s1[2] == '\0')))) &&
                   (show_help_info == false)) {
                  pbVar2 = &show_help_info;
                }
                else {
                  iVar1 = strcmp(__s1,"--wait-before-exit");
                  if (((iVar1 == 0) || ((__s1[1] == 'w' && (__s1[2] == '\0')))) &&
                     (wait_before_exit == false)) {
                    pbVar2 = &wait_before_exit;
                  }
                  else {
                    iVar1 = strcmp(__s1,"--version");
                    if (((iVar1 != 0) && ((__s1[1] != 'v' || (__s1[2] != '\0')))) ||
                       (show_version_info != false)) {
                      iVar1 = strcmp(__s1,"--csym");
                      if (iVar1 == 0) {
                        if (iVar6 != 0) goto LAB_00121455;
                      }
                      else if ((__s1[1] != 'g') || (__s1[2] != '\0' || iVar6 != 0)) {
LAB_00121455:
                        iVar1 = strcmp(__s1,"--log-path");
                        if (iVar1 == 0) {
                          if (local_b4 != 0) goto LAB_001214a5;
                        }
                        else if ((__s1[1] != 'l') || (__s1[2] != '\0' || local_b4 != 0)) {
LAB_001214a5:
                          iVar1 = strcmp(__s1,"--import-path");
                          if (iVar1 == 0) {
                            if (local_b8 != 0) goto LAB_001214df;
                          }
                          else if ((__s1[1] != 'i') || (__s1[2] != '\0' || local_b8 != 0)) {
LAB_001214df:
                            iVar1 = strcmp(__s1,"--stack-resize");
                            if (((iVar1 != 0) && ((__s1[1] != 'S' || (__s1[2] != '\0')))) ||
                               (bVar7 = local_b0 != 0, local_b0 = 1, bVar7)) {
                              pfVar3 = (fatal_error *)__cxa_allocate_exception(0x28);
                              std::__cxx11::string::string
                                        ((string *)&local_98,"argument syntax error.",
                                         (allocator *)&local_70);
                              cs::fatal_error::fatal_error(pfVar3,&local_98);
                              __cxa_throw(pfVar3,&cs::fatal_error::typeinfo,
                                          cs::fatal_error::~fatal_error);
                            }
                            goto LAB_00121494;
                          }
                          local_b8 = 1;
                          goto LAB_00121494;
                        }
                        local_b4 = 1;
                        goto LAB_00121494;
                      }
                      iVar6 = 1;
                      goto LAB_00121494;
                    }
                    pbVar2 = &show_version_info;
                  }
                }
              }
            }
          }
        }
      }
      *pbVar2 = true;
    }
LAB_00121494:
    lVar4 = lVar4 + 1;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int covscript_args(int args_size, char *args[])
{
	int expect_csym = 0;
	int expect_log_path = 0;
	int expect_import_path = 0;
	int expect_stack_resize = 0;
	int index = 1;
	for (; index < args_size; ++index) {
		if (expect_csym == 1) {
			csym_path = cs::process_path(args[index]);
			expect_csym = 2;
		}
		else if (expect_log_path == 1) {
			log_path = cs::process_path(args[index]);
			expect_log_path = 2;
		}
		else if (expect_import_path == 1) {
			cs::current_process->import_path += cs::path_delimiter + cs::process_path(args[index]);
			expect_import_path = 2;
		}
		else if (expect_stack_resize == 1) {
			cs::current_process->resize_stack(std::stoul(args[index]));
			expect_stack_resize = 2;
		}
		else if (args[index][0] == '-') {
			if (std::strcmp(args[index], "--args") == 0 || std::strcmp(args[index], "-a") == 0) {
				repl = true;
				return ++index;
			}
			else if ((std::strcmp(args[index], "--silent") == 0 || std::strcmp(args[index], "-s") == 0) && !silent)
				silent = true;
			else if ((std::strcmp(args[index], "--dump-ast") == 0 || std::strcmp(args[index], "-d") == 0) && !dump_ast)
				dump_ast = true;
			else if ((std::strcmp(args[index], "--dependency") == 0 || std::strcmp(args[index], "-r") == 0) &&
			         !dump_dependency)
				dump_dependency = true;
			else if ((std::strcmp(args[index], "--no-optimize") == 0 || std::strcmp(args[index], "-o") == 0) &&
			         !no_optimize)
				no_optimize = true;
			else if ((std::strcmp(args[index], "--compile-only") == 0 || std::strcmp(args[index], "-c") == 0) &&
			         !compile_only)
				compile_only = true;
			else if ((std::strcmp(args[index], "--help") == 0 || std::strcmp(args[index], "-h") == 0) &&
			         !show_help_info)
				show_help_info = true;
			else if ((std::strcmp(args[index], "--wait-before-exit") == 0 || std::strcmp(args[index], "-w") == 0) &&
			         !wait_before_exit)
				wait_before_exit = true;
			else if ((std::strcmp(args[index], "--version") == 0 || std::strcmp(args[index], "-v") == 0) &&
			         !show_version_info)
				show_version_info = true;
			else if ((std::strcmp(args[index], "--csym") == 0 || std::strcmp(args[index], "-g") == 0) &&
			         expect_csym == 0)
				expect_csym = 1;
			else if ((std::strcmp(args[index], "--log-path") == 0 || std::strcmp(args[index], "-l") == 0) &&
			         expect_log_path == 0)
				expect_log_path = 1;
			else if ((std::strcmp(args[index], "--import-path") == 0 || std::strcmp(args[index], "-i") == 0) &&
			         expect_import_path == 0)
				expect_import_path = 1;
			else if ((std::strcmp(args[index], "--stack-resize") == 0 || std::strcmp(args[index], "-S") == 0) &&
			         expect_stack_resize == 0)
				expect_stack_resize = 1;
			else
				throw cs::fatal_error("argument syntax error.");
		}
		else
			break;
	}
	if (expect_csym == 1 || expect_log_path == 1 || expect_import_path == 1 || expect_import_path == 1)
		throw cs::fatal_error("argument syntax error.");
	return index;
}